

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void free_arg_list(JSContext *ctx,JSValue *tab,uint32_t len)

{
  long lVar1;
  JSValue v;
  
  for (lVar1 = 0; (ulong)len << 4 != lVar1; lVar1 = lVar1 + 0x10) {
    v.tag = *(int64_t *)((long)&tab->tag + lVar1);
    v.u.ptr = ((JSValueUnion *)((long)&tab->u + lVar1))->ptr;
    JS_FreeValue(ctx,v);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,tab);
  return;
}

Assistant:

static void free_arg_list(JSContext *ctx, JSValue *tab, uint32_t len)
{
    uint32_t i;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, tab[i]);
    }
    js_free(ctx, tab);
}